

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
ArrayState<true>::Float(ArrayState<true> *this,Context<true> *ctx,float f)

{
  _func_int **pp_Var1;
  ostream *poVar2;
  Namespace<true> *pNVar3;
  BaseState<true> *in_RDI;
  stringstream str;
  string local_1d0 [8];
  char *in_stack_fffffffffffffe38;
  feature_index in_stack_fffffffffffffe40;
  feature_value in_stack_fffffffffffffe4c;
  Namespace<true> *in_stack_fffffffffffffe50;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(&local_190,'[');
  pp_Var1 = in_RDI[1]._vptr_BaseState;
  pNVar3 = Context<true>::CurrentNamespace((Context<true> *)0x272de8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(long)pp_Var1 - pNVar3->namespace_hash);
  std::operator<<(poVar2,']');
  Context<true>::CurrentNamespace((Context<true> *)0x272e23);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  Namespace<true>::AddFeature
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  in_RDI[1]._vptr_BaseState = (_func_int **)((long)in_RDI[1]._vptr_BaseState + 1);
  return in_RDI;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float f)
  {
    if (audit)
    {
      stringstream str;
      str << '[' << (array_hash - ctx.CurrentNamespace().namespace_hash) << ']';

      ctx.CurrentNamespace().AddFeature(f, array_hash, str.str().c_str());
    }
    else
      ctx.CurrentNamespace().AddFeature(f, array_hash, nullptr);
    array_hash++;

    return this;
  }